

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlogging.c
# Opt level: O3

void LogBinary(char *comment,void *data,size_t size)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  void *pvVar6;
  char charBuf [17];
  char hexBuf [49];
  
  if (global_log_function != (LOGGER_LOG)0x0) {
    (*global_log_function)
              (AZ_LOG_TRACE,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/xlogging.c"
               ,"LogBinary",0x3b,1,"%s     %lu bytes",comment,size);
  }
  if (size != 0) {
    pvVar6 = (void *)((long)data + 1);
    uVar1 = 0;
    do {
      bVar3 = *(byte *)((long)pvVar6 + -1);
      bVar4 = bVar3;
      if (0x5e < (byte)(bVar3 - 0x20)) {
        bVar4 = 0x2e;
      }
      charBuf[uVar1] = bVar4;
      cVar5 = (bVar3 >> 4) + 0x37;
      if (bVar3 < 0xa0) {
        cVar5 = (bVar3 >> 4) + 0x30;
      }
      lVar2 = uVar1 * 3;
      hexBuf[lVar2] = cVar5;
      bVar3 = bVar3 & 0xf;
      cVar5 = bVar3 + 0x37;
      if (bVar3 < 10) {
        cVar5 = bVar3 + 0x30;
      }
      hexBuf[lVar2 + 1] = cVar5;
      hexBuf[lVar2 + 2] = ' ';
      uVar1 = uVar1 + 1;
      if (uVar1 == 0x10) {
        charBuf[0x10] = '\0';
        hexBuf[0x30] = '\0';
        if (global_log_function != (LOGGER_LOG)0x0) {
          (*global_log_function)
                    (AZ_LOG_TRACE,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/xlogging.c"
                     ,"LogBinary",0x52,1,"%p: %s    %s",data,hexBuf,charBuf);
        }
        uVar1 = 0;
        data = pvVar6;
      }
      pvVar6 = (void *)((long)pvVar6 + 1);
      size = size - 1;
    } while (size != 0);
    if (uVar1 != 0) {
      charBuf[uVar1] = '\0';
      lVar2 = uVar1 * 3;
      hexBuf[lVar2] = ' ';
      (hexBuf + lVar2 + 1)[0] = ' ';
      (hexBuf + lVar2 + 1)[1] = ' ';
      if (uVar1 < 0xf) {
        memset(hexBuf + lVar2 + 3,0x20,uVar1 * -3 + 0x2d);
        lVar2 = 0x10;
      }
      else {
        lVar2 = uVar1 + 1;
      }
      hexBuf[lVar2 * 3] = '\0';
      if (global_log_function != (LOGGER_LOG)0x0) {
        (*global_log_function)
                  (AZ_LOG_TRACE,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/xlogging.c"
                   ,"LogBinary",0x6b,1,"%p: %s    %s",data,hexBuf,charBuf);
      }
    }
  }
  return;
}

Assistant:

void LogBinary(const char* comment, const void* data, size_t size)
{
    char charBuf[LINE_SIZE + 1];
    char hexBuf[LINE_SIZE * 3 + 1];
    size_t countbuf = 0;
    size_t i = 0;
    const unsigned char* bufAsChar = (const unsigned char*)data;
    const unsigned char* startPos = bufAsChar;

    LOG(AZ_LOG_TRACE, LOG_LINE, "%s     %lu bytes", comment, (unsigned long)size);

    /* Print the whole buffer. */
    for (i = 0; i < size; i++)
    {
        /* Store the printable value of the char in the charBuf to print. */
        charBuf[countbuf] = PRINTABLE(*bufAsChar);

        /* Convert the high nibble to a printable hexadecimal value. */
        hexBuf[countbuf * 3] = HEX_STR(*bufAsChar >> 4);

        /* Convert the low nibble to a printable hexadecimal value. */
        hexBuf[countbuf * 3 + 1] = HEX_STR(*bufAsChar);

        hexBuf[countbuf * 3 + 2] = ' ';

        countbuf++;
        bufAsChar++;
        /* If the line is full, print it to start another one. */
        if (countbuf == LINE_SIZE)
        {
            charBuf[countbuf] = '\0';
            hexBuf[countbuf * 3] = '\0';
            LOG(AZ_LOG_TRACE, LOG_LINE, "%p: %s    %s", startPos, hexBuf, charBuf);
            countbuf = 0;
            startPos = bufAsChar;
        }
    }

    /* If the last line does not fit the line size. */
    if (countbuf > 0)
    {
        /* Close the charBuf string. */
        charBuf[countbuf] = '\0';
        hexBuf[countbuf * 3] = ' ';
        hexBuf[countbuf * 3 + 1] = ' ';
        hexBuf[countbuf * 3 + 2] = ' ';

        /* Fill the hexBuf with spaces to keep the charBuf alignment. */
        while ((countbuf++) < LINE_SIZE - 1)
        {
            hexBuf[countbuf * 3] = ' ';
            hexBuf[countbuf * 3 + 1] = ' ';
            hexBuf[countbuf * 3 + 2] = ' ';
        }
        hexBuf[countbuf * 3] = '\0';

        /* Print the last line. */
        LOG(AZ_LOG_TRACE, LOG_LINE, "%p: %s    %s", startPos, hexBuf, charBuf);
    }
}